

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::EmitTest::EmitTest
          (EmitTest *this,Context *context,char *name,char *desc,int emitCountA,int endCountA,
          int emitCountB,int endCountB,GLenum outputType)

{
  int endCountA_local;
  int emitCountA_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  EmitTest *this_local;
  
  GeometryShaderRenderTest::GeometryShaderRenderTest
            (&this->super_GeometryShaderRenderTest,context,name,desc,0,outputType,"a_color",0);
  (this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__EmitTest_032bdc28;
  this->m_program = (VertexEmitterShader *)0x0;
  this->m_emitCountA = emitCountA;
  this->m_endCountA = endCountA;
  this->m_emitCountB = emitCountB;
  this->m_endCountB = endCountB;
  this->m_outputType = outputType;
  return;
}

Assistant:

EmitTest::EmitTest (Context& context, const char* name, const char* desc, int emitCountA, int endCountA, int emitCountB, int endCountB, GLenum outputType)
	: GeometryShaderRenderTest	(context, name, desc, GL_POINTS, outputType, "a_color")
	, m_program					(DE_NULL)
	, m_emitCountA				(emitCountA)
	, m_endCountA				(endCountA)
	, m_emitCountB				(emitCountB)
	, m_endCountB				(endCountB)
	, m_outputType				(outputType)
{
}